

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::MetaVariable::
set_value<std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>>
          (MetaVariable *this,
          vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *v)

{
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  linb::any::operator=((any *)this,v);
  local_30 = 0;
  local_28 = 0;
  local_38 = &local_28;
  ::std::__cxx11::string::operator=((string *)&this->_name,(string *)&local_38);
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  return;
}

Assistant:

void set_value(const T &v) {
    // TODO: Check T is supported type for Metadatum.
    _value = v;

    _name = std::string();  // empty
  }